

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlElemDesc * htmlTagLookup(xmlChar *tag)

{
  int iVar1;
  uint local_1c;
  uint i;
  xmlChar *tag_local;
  
  local_1c = 0;
  while( true ) {
    if (0x5b < local_1c) {
      return (htmlElemDesc *)0x0;
    }
    iVar1 = xmlStrcasecmp(tag,(xmlChar *)html40ElementTable[local_1c].name);
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  return html40ElementTable + local_1c;
}

Assistant:

const htmlElemDesc *
htmlTagLookup(const xmlChar *tag) {
    unsigned int i;

    for (i = 0; i < (sizeof(html40ElementTable) /
                     sizeof(html40ElementTable[0]));i++) {
        if (!xmlStrcasecmp(tag, BAD_CAST html40ElementTable[i].name))
	    return((htmlElemDescPtr) &html40ElementTable[i]);
    }
    return(NULL);
}